

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::getGlobalElemDecl(TraverseSchema *this,DOMElement *elem,XMLCh *qName)

{
  SchemaInfo **enclosingSchema;
  uint saveScope;
  SchemaInfo *toRestore;
  bool bVar1;
  uint namespaceURI;
  int iVar2;
  XMLCh *pXVar3;
  XMLCh *text2;
  undefined4 extraout_var;
  Grammar *pGVar4;
  undefined4 extraout_var_00;
  DOMElement *elem_00;
  SchemaElementDecl *pSVar5;
  SchemaInfo *toRestore_00;
  undefined1 *msgDomain;
  ListType local_54;
  
  pXVar3 = getPrefix(this,qName);
  pXVar3 = resolvePrefixToURI(this,elem,pXVar3);
  text2 = getLocalPart(this,qName);
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                           (this->fURIStringPool,pXVar3);
  if (this->fSchemaInfo->fTargetNSURI == namespaceURI) {
    iVar2 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                      (this->fSchemaGrammar,(ulong)(uint)this->fTargetNSURI,text2,0,
                       0xfffffffffffffffe);
    pSVar5 = (SchemaElementDecl *)CONCAT44(extraout_var,iVar2);
    local_54 = INCLUDE;
    if (pSVar5 == (SchemaElementDecl *)0x0) {
LAB_0031de6d:
      elem_00 = SchemaInfo::getTopLevelComponent
                          (*enclosingSchema,5,(XMLCh *)SchemaSymbols::fgELT_ELEMENT,text2,
                           enclosingSchema);
      if ((elem_00 == (DOMElement *)0x0) ||
         (pSVar5 = traverseElementDecl(this,elem_00,true), pSVar5 == (SchemaElementDecl *)0x0)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,pXVar3,text2,(XMLCh *)0x0,
                          (XMLCh *)0x0);
        pSVar5 = (SchemaElementDecl *)0x0;
      }
    }
    else {
LAB_0031ddcb:
      local_54 = INCLUDE;
    }
    if (toRestore != *enclosingSchema) {
      restoreSchemaInfo(this,toRestore,local_54,saveScope);
    }
  }
  else {
    bVar1 = isImportingNS(this,namespaceURI);
    if (bVar1) {
      pGVar4 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar3);
      if ((pGVar4 != (Grammar *)0x0) &&
         (iVar2 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[5])(pGVar4), iVar2 == 1)) {
        iVar2 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[0xb])
                          (pGVar4,(ulong)namespaceURI,text2,0,0xfffffffffffffffe);
        pSVar5 = (SchemaElementDecl *)CONCAT44(extraout_var_00,iVar2);
        if (pSVar5 == (SchemaElementDecl *)0x0) {
          toRestore_00 = SchemaInfo::getImportInfo(*enclosingSchema,namespaceURI);
          if ((toRestore_00 == (SchemaInfo *)0x0) || (toRestore_00->fProcessed == true)) {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,pXVar3,text2,
                              (XMLCh *)0x0,(XMLCh *)0x0);
            return (SchemaElementDecl *)0x0;
          }
          local_54 = IMPORT;
          restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
          goto LAB_0031de6d;
        }
        goto LAB_0031ddcb;
      }
      msgDomain = XMLUni::fgValidityDomain;
      iVar2 = 0x26;
    }
    else {
      msgDomain = XMLUni::fgXMLErrDomain;
      iVar2 = 0x8e;
    }
    pSVar5 = (SchemaElementDecl *)0x0;
    reportSchemaError(this,elem,(XMLCh *)msgDomain,iVar2,pXVar3,(XMLCh *)0x0,(XMLCh *)0x0,
                      (XMLCh *)0x0);
  }
  return pSVar5;
}

Assistant:

SchemaElementDecl*
TraverseSchema::getGlobalElemDecl(const DOMElement* const elem,
                                  const XMLCh* const qName)
{
    const XMLCh*         nameURI =  resolvePrefixToURI(elem, getPrefix(qName));
    const XMLCh*         localPart = getLocalPart(qName);
    SchemaElementDecl*   elemDecl = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;
    unsigned int         uriId = fURIStringPool->addOrFind(nameURI);

    if (fSchemaInfo->getTargetNSURI() != (int) uriId)
    {
    //if (!XMLString::equals(nameURI, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        if (!isImportingNS(uriId))
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, nameURI);
            return 0;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(nameURI);

        if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType)
        {
            elemDecl = (SchemaElementDecl*) grammar->getElemDecl(
                uriId, localPart, 0, Grammar::TOP_LEVEL_SCOPE);
        }
        else
        {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, nameURI);
            return 0;
        }

        if (!elemDecl)
        {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);
            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, nameURI, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }
    else
    {
        elemDecl = (SchemaElementDecl*)
            fSchemaGrammar->getElemDecl(fTargetNSURI, localPart, 0, Grammar::TOP_LEVEL_SCOPE);
    }

    if (!elemDecl)
    {
        DOMElement* subsGroupElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Element,
            SchemaSymbols::fgELT_ELEMENT,localPart, &fSchemaInfo);

        if (subsGroupElem)
            elemDecl = traverseElementDecl(subsGroupElem, true);

        if (!elemDecl)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, nameURI, localPart);
    }

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    return elemDecl;
}